

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

bool __thiscall cmCMakePath::IsPrefix(cmCMakePath *this,cmCMakePath *path)

{
  bool bVar1;
  bool bVar2;
  path *__rhs;
  path *__lhs;
  iterator prefix_it;
  iterator path_it;
  iterator path_end;
  iterator prefix_end;
  iterator local_88;
  iterator local_70;
  iterator local_58;
  iterator local_40;
  
  std::filesystem::__cxx11::path::begin(&local_88,&this->Path);
  std::filesystem::__cxx11::path::end(&local_40,&this->Path);
  std::filesystem::__cxx11::path::begin(&local_70,&path->Path);
  std::filesystem::__cxx11::path::end(&local_58,&path->Path);
  while( true ) {
    bVar1 = std::filesystem::__cxx11::operator!=(&local_88,&local_40);
    if (!bVar1) break;
    bVar1 = std::filesystem::__cxx11::operator!=(&local_70,&local_58);
    if (!bVar1) break;
    __lhs = local_88._M_path;
    if ((*(byte *)&((local_88._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      __lhs = (path *)local_88._M_cur;
    }
    __rhs = local_70._M_path;
    if ((*(byte *)&((local_70._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      __rhs = (path *)local_70._M_cur;
    }
    bVar1 = std::filesystem::__cxx11::operator==(__lhs,__rhs);
    if (!bVar1) break;
    if ((*(byte *)&((local_88._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      local_88._M_cur =
           (const_iterator)&(((path *)((long)local_88._M_cur + 0x28))->_M_pathname)._M_string_length
      ;
    }
    else {
      local_88._M_at_end = true;
    }
    if ((*(byte *)&((local_70._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      local_70._M_cur =
           (const_iterator)&(((path *)((long)local_70._M_cur + 0x28))->_M_pathname)._M_string_length
      ;
    }
    else {
      local_70._M_at_end = true;
    }
  }
  bVar1 = std::filesystem::__cxx11::operator==(&local_88,&local_40);
  bVar2 = true;
  if (!bVar1) {
    if ((*(byte *)&((local_88._M_path)->_M_cmpts)._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) {
      local_88._M_path = (path *)local_88._M_cur;
    }
    if (((local_88._M_path)->_M_pathname)._M_string_length == 0) {
      bVar2 = std::filesystem::__cxx11::operator!=(&local_70,&local_58);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmCMakePath::IsPrefix(const cmCMakePath& path) const
{
  auto prefix_it = this->Path.begin();
  auto prefix_end = this->Path.end();
  auto path_it = path.Path.begin();
  auto path_end = path.Path.end();

  while (prefix_it != prefix_end && path_it != path_end &&
         *prefix_it == *path_it) {
    ++prefix_it;
    ++path_it;
  }
  return (prefix_it == prefix_end) ||
    (prefix_it->empty() && path_it != path_end);
}